

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::print_typed_timesamples<std::array<float,4ul>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedTimeSamples<std::array<float,_4UL>_> *v,uint32_t indent)

{
  string *psVar1;
  ostream *poVar2;
  uint32_t n;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  undefined8 extraout_RDX_01;
  ulong uVar4;
  long lVar5;
  stringstream ss;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"{\n",2);
  uVar3 = extraout_RDX;
  if (this[0x18] == (tinyusdz)0x1) {
    TypedTimeSamples<std::array<float,_4UL>_>::update
              ((TypedTimeSamples<std::array<float,_4UL>_> *)this);
    uVar3 = extraout_RDX_00;
  }
  n = (uint32_t)uVar3;
  if (*(long *)(this + 8) != *(long *)this) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      pprint::Indent_abi_cxx11_(&local_1e0,(pprint *)(ulong)((int)v + 1),(uint32_t)uVar3);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      poVar2 = ::std::ostream::_M_insert<double>(*(double *)(*(long *)this + lVar5));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if (*(char *)(*(long *)this + 0x18 + lVar5) == '\x01') {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"None",4);
      }
      else {
        ::std::operator<<(local_1a8,(float4 *)(*(long *)this + lVar5 + 8));
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",\n",2);
      n = (uint32_t)extraout_RDX_01;
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x20;
      uVar3 = extraout_RDX_01;
    } while (uVar4 < (ulong)(*(long *)(this + 8) - *(long *)this >> 5));
  }
  pprint::Indent_abi_cxx11_(&local_1e0,(pprint *)v,n);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  psVar1 = local_1c0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string print_typed_timesamples(const TypedTimeSamples<T> &v,
                                    const uint32_t indent = 0) {
  std::stringstream ss;

  ss << "{\n";

  const auto &samples = v.get_samples();

  for (size_t i = 0; i < samples.size(); i++) {
    ss << pprint::Indent(indent + 1) << samples[i].t << ": ";
    if (samples[i].blocked) {
      ss << "None";
    } else {
      ss << samples[i].value;
    }
    ss << ",\n";
  }

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}